

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::task_pool::task_pool(task_pool *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  spinlock::spinlock((spinlock *)this);
  lVar2 = 8;
  do {
    puVar1 = (undefined8 *)((long)&(this->m_task_stack).m_stack[0].m_data + lVar2 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_task_stack).m_stack + lVar2 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x208);
  (this->m_task_stack).m_top = 0;
  this->m_num_threads = 0;
  semaphore::semaphore(&this->m_tasks_available,0,0x7fff,(char *)0x0);
  semaphore::semaphore(&this->m_all_tasks_completed,0,1,(char *)0x0);
  this->m_total_submitted_tasks = 0;
  this->m_total_completed_tasks = 0;
  this->m_exit_flag = 0;
  this->m_threads[0] = 0;
  this->m_threads[1] = 0;
  this->m_threads[2] = 0;
  this->m_threads[3] = 0;
  this->m_threads[4] = 0;
  this->m_threads[5] = 0;
  this->m_threads[6] = 0;
  this->m_threads[7] = 0;
  this->m_threads[8] = 0;
  this->m_threads[9] = 0;
  this->m_threads[10] = 0;
  this->m_threads[0xb] = 0;
  this->m_threads[0xc] = 0;
  this->m_threads[0xd] = 0;
  this->m_threads[0xe] = 0;
  this->m_threads[0xf] = 0;
  return;
}

Assistant:

task_pool::task_pool()
    : m_num_threads(0),
      m_tasks_available(0, 32767),
      m_all_tasks_completed(0, 1),
      m_total_submitted_tasks(0),
      m_total_completed_tasks(0),
      m_exit_flag(false) {
  utils::zero_object(m_threads);
}